

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall
ImVector<ImGuiOldColumns>::push_back(ImVector<ImGuiOldColumns> *this,ImGuiOldColumns *v)

{
  void *in_RSI;
  ImVector<ImGuiOldColumns> *in_RDI;
  ImVector<ImGuiOldColumns> *unaff_retaddr;
  ImVector<ImGuiOldColumns> *pIVar1;
  
  if (in_RDI->Size == in_RDI->Capacity) {
    pIVar1 = in_RDI;
    _grow_capacity(in_RDI,in_RDI->Size + 1);
    reserve(unaff_retaddr,(int)((ulong)pIVar1 >> 0x20));
  }
  memcpy(in_RDI->Data + in_RDI->Size,in_RSI,0x88);
  in_RDI->Size = in_RDI->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }